

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void add_bit_field(c2m_ctx_t c2m_ctx,uint64_t *u,uint64_t v,decl_t member_decl)

{
  int iVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  size_t size;
  int width;
  int bit_offset;
  uint64_t mask2;
  uint64_t mask;
  decl_t member_decl_local;
  uint64_t v_local;
  uint64_t *u_local;
  c2m_ctx_t c2m_ctx_local;
  
  iVar3 = member_decl->bit_offset;
  iVar1 = member_decl->width;
  type_size(c2m_ctx,(member_decl->decl_spec).type);
  cVar2 = (char)iVar1;
  uVar4 = 0xffffffffffffffff >> (0x40U - cVar2 & 0x3f);
  bVar5 = (byte)iVar3;
  *u = (uVar4 << (bVar5 & 0x3f) ^ 0xffffffffffffffff) & *u;
  iVar3 = signed_integer_type_p((member_decl->decl_spec).type);
  member_decl_local = (decl_t)v;
  if (iVar3 != 0) {
    member_decl_local = (decl_t)((long)(v << (0x40U - cVar2 & 0x3f)) >> (0x40U - cVar2 & 0x3f));
  }
  *u = (uVar4 & (ulong)member_decl_local) << (bVar5 & 0x3f) | *u;
  return;
}

Assistant:

static void add_bit_field (c2m_ctx_t c2m_ctx, uint64_t *u, uint64_t v, decl_t member_decl) {
  uint64_t mask, mask2;
  int bit_offset = member_decl->bit_offset, width = member_decl->width;
  size_t MIR_UNUSED size = type_size (c2m_ctx, member_decl->decl_spec.type) * MIR_CHAR_BIT;

  mask = 0xffffffffffffffff >> (64 - width);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  mask2 = ~(mask << bit_offset);
#else
  mask2 = ~(mask << (size - bit_offset - width));
#endif
  *u &= mask2;
  if (signed_integer_type_p (member_decl->decl_spec.type)) {
    v <<= (64 - width);
    v = (int64_t) v >> (64 - width);
  }
  v &= mask;
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  v <<= bit_offset;
#else
  v <<= size - bit_offset - width;
#endif
  *u |= v;
}